

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece_processor.cc
# Opt level: O2

Status __thiscall
sentencepiece::SentencePieceProcessor::Encode
          (SentencePieceProcessor *this,string_view input,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *pieces)

{
  ostringstream *this_00;
  Status *_status;
  long *plVar1;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *in_R8;
  long lVar2;
  void **ppvVar3;
  SentencePieceText spt;
  undefined1 local_1b0 [56];
  int local_178;
  Rep *local_170;
  
  plVar1 = (long *)input._M_len;
  (**(code **)(*plVar1 + 0x38))();
  if (this->_vptr_SentencePieceProcessor == (_func_int **)0x0) {
    util::Status::~Status((Status *)this);
    if (in_R8 == (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)0x0) {
      this_00 = (ostringstream *)(local_1b0 + 8);
      local_1b0._0_4_ = 0xd;
      std::__cxx11::ostringstream::ostringstream(this_00);
      std::operator<<((ostream *)this_00,"third_party/sentencepiece/src/sentencepiece_processor.cc")
      ;
      std::operator<<((ostream *)this_00,"(");
      std::ostream::operator<<(this_00,0x17d);
      std::operator<<((ostream *)this_00,") [");
      std::operator<<((ostream *)this_00,"pieces");
      std::operator<<((ostream *)this_00,"] ");
      std::operator<<((ostream *)this_00,"output container is null");
      util::StatusBuilder::operator_cast_to_Status((StatusBuilder *)this);
      std::__cxx11::ostringstream::~ostringstream(this_00);
    }
    else {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_R8);
      SentencePieceText::SentencePieceText((SentencePieceText *)local_1b0);
      (**(code **)(*plVar1 + 200))(this,plVar1,input._M_str,pieces,(SentencePieceText *)local_1b0);
      if (this->_vptr_SentencePieceProcessor == (_func_int **)0x0) {
        util::Status::~Status((Status *)this);
        ppvVar3 = local_170->elements;
        if (local_170 == (Rep *)0x0) {
          ppvVar3 = (void **)0x0;
        }
        for (lVar2 = 0; (long)local_178 * 8 != lVar2; lVar2 = lVar2 + 8) {
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string_const&>
                    (in_R8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (*(ulong *)(*(long *)((long)ppvVar3 + lVar2) + 0x30) & 0xfffffffffffffffe
                           ));
        }
        util::Status::Status((Status *)this);
      }
      SentencePieceText::~SentencePieceText((SentencePieceText *)local_1b0);
    }
  }
  return (unique_ptr<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
          )(unique_ptr<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
            )this;
}

Assistant:

util::Status SentencePieceProcessor::Encode(
    absl::string_view input, std::vector<std::string> *pieces) const {
  CHECK_OR_RETURN_STATUS_STL(pieces);

  SentencePieceText spt;
  RETURN_IF_ERROR(Encode(input, &spt));
  for (const auto &sp : spt.pieces()) {
    pieces->emplace_back(sp.piece());
  }

  return util::OkStatus();
}